

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O3

void test_divceil<std::vector<signed_char,std::allocator<signed_char>>,unsigned_int>
               (vector<signed_char,_std::allocator<signed_char>_> *values,uint divisor,
               size_t attempt_count)

{
  char *pcVar1;
  enable_if_t<std::is_signed<signed_char>::value_&&_std::is_unsigned<unsigned_int>::value_&&_std::is_same<std::common_type_t<signed_char,_unsigned_int>,_unsigned_int>::value,_signed_char>
  eVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 extraout_RDX;
  char cVar5;
  char cVar6;
  size_t sVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  char local_49;
  double local_48;
  long local_40;
  vector<signed_char,_std::allocator<signed_char>_> *local_38;
  
  local_38 = values;
  auVar9 = std::chrono::_V2::steady_clock::now();
  local_40 = auVar9._0_8_;
  cVar6 = '\0';
  local_48 = (double)attempt_count;
  if (attempt_count != 0) {
    sVar7 = 0;
    do {
      pcVar1 = (local_38->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      cVar5 = '\0';
      for (pcVar8 = (local_38->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                    _M_impl.super__Vector_impl_data._M_start; local_40 = auVar9._0_8_,
          pcVar8 != pcVar1; pcVar8 = pcVar8 + 1) {
        eVar2 = burst::divceil<signed_char,unsigned_int>
                          ((burst *)(ulong)(uint)(int)*pcVar8,(Integer<signed_char>)divisor,
                           auVar9._8_4_);
        auVar9._8_8_ = extraout_RDX;
        auVar9._0_8_ = local_40;
        cVar5 = cVar5 + eVar2;
      }
      cVar6 = cVar6 + cVar5;
      sVar7 = sVar7 + 1;
    } while ((double)sVar7 != local_48);
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  lVar3 = lVar3 - local_40;
  local_49 = cVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,&local_49,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_48 = (double)lVar3 / 1000000000.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_1f098,0xc)
  ;
  poVar4 = std::ostream::_M_insert<double>(local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}